

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiGetMemoryCommitment.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::MemoryCommitmentAllocateOnlyTestInstance::iterate
          (TestStatus *__return_storage_ptr__,MemoryCommitmentAllocateOnlyTestInstance *this)

{
  ostringstream *this_00;
  ulong uVar1;
  TestStatus *pTVar2;
  int iVar3;
  VkPhysicalDevice physicalDevice;
  VkDevice device;
  InstanceInterface *vk;
  DeviceInterface *vk_00;
  int i;
  long lVar4;
  long lVar5;
  VkDeviceSize pCommittedMemoryInBytes;
  VkMemoryAllocateInfo memAllocInfo;
  VkDeviceSize allocSize [10];
  VkPhysicalDeviceMemoryProperties pMemoryProperties;
  ulong local_460;
  TestStatus *local_458;
  MemoryCommitmentAllocateOnlyTestInstance *local_450;
  Move<vk::Handle<(vk::HandleType)7>_> local_448;
  VkMemoryAllocateInfo local_428;
  undefined1 local_408 [16];
  TestLog local_3f8 [13];
  ios_base local_390 [264];
  ulong auStack_288 [10];
  VkPhysicalDeviceMemoryProperties local_238;
  
  local_458 = __return_storage_ptr__;
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  local_450 = this;
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties(&local_238,vk,physicalDevice);
  local_460 = 0;
  lVar4 = 0;
  do {
    iVar3 = rand();
    auStack_288[lVar4] = (long)(iVar3 % 1000 + 1);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 10);
  this_00 = (ostringstream *)(local_408 + 8);
  lVar4 = 0;
  do {
    if ((local_238.memoryTypes[lVar4].propertyFlags & 0x10) != 0) {
      lVar5 = 0;
      do {
        local_428.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
        local_428.pNext = (void *)0x0;
        uVar1 = auStack_288[lVar5];
        local_428.memoryTypeIndex = (deUint32)lVar4;
        local_428.allocationSize = uVar1;
        ::vk::allocateMemory(&local_448,vk_00,device,&local_428,(VkAllocationCallbacks *)0x0);
        (*vk_00->_vptr_DeviceInterface[0xb])
                  (vk_00,device,
                   local_448.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal,
                   &local_460);
        if (local_460 != 0) {
          local_408._0_8_ = ((local_450->super_TestInstance).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this_00,"Warning: Memory commitment not null before binding.",0x33);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          std::ios_base::~ios_base(local_390);
          if (uVar1 < local_460) {
            local_408._0_8_ = local_3f8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Fail","");
            pTVar2 = local_458;
            local_458->m_code = QP_TEST_RESULT_FAIL;
            (local_458->m_description)._M_dataplus._M_p =
                 (pointer)&(local_458->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_458->m_description,local_408._0_8_,
                       (long)(qpTestLog **)local_408._0_8_ + local_408._8_8_);
            if ((TestLog *)local_408._0_8_ != local_3f8) {
              operator_delete((void *)local_408._0_8_,
                              (ulong)((long)&(local_3f8[0].m_log)->flags + 1));
            }
            if (local_448.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal ==
                0) {
              return pTVar2;
            }
            ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                      (&local_448.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                       (VkDeviceMemory)
                       local_448.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                       m_internal);
            return pTVar2;
          }
        }
        if (local_448.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::operator()
                    (&local_448.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter,
                     (VkDeviceMemory)
                     local_448.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                     m_internal);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 10);
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 0x20) {
      local_408._0_8_ = local_3f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Pass","");
      pTVar2 = local_458;
      local_458->m_code = QP_TEST_RESULT_PASS;
      (local_458->m_description)._M_dataplus._M_p = (pointer)&(local_458->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_458->m_description,local_408._0_8_,
                 (long)(qpTestLog **)local_408._0_8_ + local_408._8_8_);
      if ((TestLog *)local_408._0_8_ != local_3f8) {
        operator_delete((void *)local_408._0_8_,(ulong)((long)&(local_3f8[0].m_log)->flags + 1));
      }
      return pTVar2;
    }
  } while( true );
}

Assistant:

tcu::TestStatus MemoryCommitmentAllocateOnlyTestInstance::iterate(void)
{
	const VkPhysicalDevice					physicalDevice			= m_context.getPhysicalDevice();
	const VkDevice							device					= m_context.getDevice();
	const InstanceInterface&				vki						= m_context.getInstanceInterface();
	const DeviceInterface&					vkd						= m_context.getDeviceInterface();
	const VkPhysicalDeviceMemoryProperties	pMemoryProperties		= getPhysicalDeviceMemoryProperties(vki,physicalDevice);
	const VkMemoryPropertyFlags				propertyFlag			= VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT;
	const int								arrayLength				= 10;
	VkDeviceSize							pCommittedMemoryInBytes = 0u;
	VkDeviceSize							allocSize[arrayLength];

	// generating random allocation sizes
	for (int i = 0; i < arrayLength; ++i)
	{
		allocSize[i] = rand() % 1000 + 1;
	}

	for (deUint32 memoryTypeIndex = 0u; memoryTypeIndex < VK_MAX_MEMORY_TYPES; ++memoryTypeIndex) //for memoryTypes
	{
		if((pMemoryProperties.memoryTypes[memoryTypeIndex].propertyFlags & propertyFlag) == propertyFlag) //if supports Lazy allocation
		{
			for (int i = 0; i < arrayLength; ++i)
			{
				const VkMemoryAllocateInfo	memAllocInfo =
				{
					VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	//	VkStructureType		sType
					NULL,									//	const void*			pNext
					allocSize[i],							//	VkDeviceSize		allocationSize
					memoryTypeIndex							//	deUint32			memoryTypeIndex
				};

				Move<VkDeviceMemory> memory = allocateMemory(vkd, device, &memAllocInfo, (const VkAllocationCallbacks*)DE_NULL);

				vkd.getDeviceMemoryCommitment(device, memory.get(), &pCommittedMemoryInBytes);
				if(pCommittedMemoryInBytes != 0)
				{
					tcu::TestLog& log = m_context.getTestContext().getLog();
					log << TestLog::Message << "Warning: Memory commitment not null before binding." << TestLog::EndMessage;
				}
				if(pCommittedMemoryInBytes > allocSize[i])
					return tcu::TestStatus::fail("Fail");

			}
		}
	}
	return tcu::TestStatus::pass("Pass");
}